

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::PickNegLogSoftmax::backward_impl
          (PickNegLogSoftmax *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Tensor *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar9;
  pointer puVar10;
  pointer puVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined8 uVar18;
  undefined1 auVar19 [16];
  byte bVar20;
  byte bVar21;
  PointerType pfVar22;
  ulong uVar23;
  ulong uVar24;
  runtime_error *this_01;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  ushort uVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  int iVar41;
  int iVar42;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_f8;
  undefined1 local_d8 [64];
  undefined1 local_98 [64];
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  this_00 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
             _M_impl.super__Vector_impl_data._M_start;
  uVar3 = (this_00->d).nd;
  uVar28 = (ulong)uVar3;
  if ((1 < uVar28) && ((this_00->d).d[1] != 1)) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_01,"PickNegLogSoftmax::backward not yet implemented for multiple columns");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (this->pval == (uint *)0x0) {
    pvVar9 = this->pvals;
    if (pvVar9 == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      __assert_fail("pvals",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                    ,0x4b8,
                    "virtual void cnn::PickNegLogSoftmax::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                   );
    }
    puVar10 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    puVar11 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    uVar26 = (long)puVar11 - (long)puVar10 >> 2;
    if (uVar26 != (fx->d).bd) {
      __assert_fail("pvals->size() == fx.d.batch_elems()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                    ,0x4b9,
                    "virtual void cnn::PickNegLogSoftmax::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                   );
    }
    if (puVar11 != puVar10) {
      pfVar12 = dEdf->v;
      uVar4 = (this_00->d).d[0];
      uVar5 = (this_00->d).bd;
      auVar34 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar6 = (dEdxi->d).nd;
      pfVar13 = this_00->v;
      uVar7 = (dEdxi->d).bd;
      uVar8 = (dEdxi->d).d[0];
      pfVar14 = dEdxi->v;
      pfVar15 = this->logz;
      uVar30 = 0;
      auVar36 = vpbroadcastq_avx512f();
      local_98 = vmovdqu64_avx512f(auVar36);
      auVar37 = vpbroadcastq_avx512f();
      local_d8 = vmovdqu64_avx512f(auVar37);
      do {
        iVar42 = 1;
        iVar41 = 1;
        if (uVar28 != 0) {
          auVar38 = vpbroadcastd_avx512f(ZEXT416(1));
          uVar23 = 0;
          do {
            auVar39 = vpbroadcastq_avx512f();
            auVar40 = vmovdqa64_avx512f(auVar38);
            auVar38 = vporq_avx512f(auVar39,auVar34);
            auVar39 = vporq_avx512f(auVar39,auVar35);
            uVar18 = vpcmpuq_avx512f(auVar39,auVar36,2);
            bVar20 = (byte)uVar18;
            uVar18 = vpcmpuq_avx512f(auVar38,auVar36,2);
            bVar21 = (byte)uVar18;
            uVar32 = CONCAT11(bVar21,bVar20);
            auVar38 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->d).d + uVar23));
            auVar39._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar38._4_4_;
            auVar39._0_4_ = (uint)(bVar20 & 1) * auVar38._0_4_;
            auVar39._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar38._8_4_;
            auVar39._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar38._12_4_;
            auVar39._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar38._16_4_;
            auVar39._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar38._20_4_;
            auVar39._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar38._24_4_;
            auVar39._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar38._28_4_;
            auVar39._32_4_ = (uint)(bVar21 & 1) * auVar38._32_4_;
            auVar39._36_4_ = (uint)(bVar21 >> 1 & 1) * auVar38._36_4_;
            auVar39._40_4_ = (uint)(bVar21 >> 2 & 1) * auVar38._40_4_;
            auVar39._44_4_ = (uint)(bVar21 >> 3 & 1) * auVar38._44_4_;
            auVar39._48_4_ = (uint)(bVar21 >> 4 & 1) * auVar38._48_4_;
            auVar39._52_4_ = (uint)(bVar21 >> 5 & 1) * auVar38._52_4_;
            auVar39._56_4_ = (uint)(bVar21 >> 6 & 1) * auVar38._56_4_;
            auVar39._60_4_ = (uint)(bVar21 >> 7) * auVar38._60_4_;
            uVar23 = uVar23 + 0x10;
            auVar38 = vpmulld_avx512f(auVar39,auVar40);
          } while ((uVar28 + 0xf & 0xfffffffffffffff0) != uVar23);
          auVar38 = vmovdqa32_avx512f(auVar38);
          auVar36._0_4_ =
               (uint)(bVar20 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar20 & 1) * auVar40._0_4_;
          bVar16 = (bool)((byte)(uVar32 >> 1) & 1);
          auVar36._4_4_ = (uint)bVar16 * auVar38._4_4_ | (uint)!bVar16 * auVar40._4_4_;
          bVar16 = (bool)((byte)(uVar32 >> 2) & 1);
          auVar36._8_4_ = (uint)bVar16 * auVar38._8_4_ | (uint)!bVar16 * auVar40._8_4_;
          bVar16 = (bool)((byte)(uVar32 >> 3) & 1);
          auVar36._12_4_ = (uint)bVar16 * auVar38._12_4_ | (uint)!bVar16 * auVar40._12_4_;
          bVar16 = (bool)((byte)(uVar32 >> 4) & 1);
          auVar36._16_4_ = (uint)bVar16 * auVar38._16_4_ | (uint)!bVar16 * auVar40._16_4_;
          bVar16 = (bool)((byte)(uVar32 >> 5) & 1);
          auVar36._20_4_ = (uint)bVar16 * auVar38._20_4_ | (uint)!bVar16 * auVar40._20_4_;
          bVar16 = (bool)((byte)(uVar32 >> 6) & 1);
          auVar36._24_4_ = (uint)bVar16 * auVar38._24_4_ | (uint)!bVar16 * auVar40._24_4_;
          bVar16 = (bool)((byte)(uVar32 >> 7) & 1);
          auVar36._28_4_ = (uint)bVar16 * auVar38._28_4_ | (uint)!bVar16 * auVar40._28_4_;
          auVar36._32_4_ =
               (uint)(bVar21 & 1) * auVar38._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar40._32_4_;
          bVar16 = (bool)(bVar21 >> 1 & 1);
          auVar36._36_4_ = (uint)bVar16 * auVar38._36_4_ | (uint)!bVar16 * auVar40._36_4_;
          bVar16 = (bool)(bVar21 >> 2 & 1);
          auVar36._40_4_ = (uint)bVar16 * auVar38._40_4_ | (uint)!bVar16 * auVar40._40_4_;
          bVar16 = (bool)(bVar21 >> 3 & 1);
          auVar36._44_4_ = (uint)bVar16 * auVar38._44_4_ | (uint)!bVar16 * auVar40._44_4_;
          bVar16 = (bool)(bVar21 >> 4 & 1);
          auVar36._48_4_ = (uint)bVar16 * auVar38._48_4_ | (uint)!bVar16 * auVar40._48_4_;
          bVar16 = (bool)(bVar21 >> 5 & 1);
          auVar36._52_4_ = (uint)bVar16 * auVar38._52_4_ | (uint)!bVar16 * auVar40._52_4_;
          bVar16 = (bool)(bVar21 >> 6 & 1);
          auVar36._56_4_ = (uint)bVar16 * auVar38._56_4_ | (uint)!bVar16 * auVar40._56_4_;
          auVar36._60_4_ =
               (uint)(bVar21 >> 7) * auVar38._60_4_ | (uint)!(bool)(bVar21 >> 7) * auVar40._60_4_;
          auVar33 = vextracti64x4_avx512f(auVar36,1);
          auVar36 = vpmulld_avx512f(auVar36,ZEXT3264(auVar33));
          auVar19 = vpmulld_avx(auVar36._0_16_,auVar36._16_16_);
          auVar17 = vpshufd_avx(auVar19,0xee);
          auVar19 = vpmulld_avx(auVar19,auVar17);
          auVar17 = vpshufd_avx(auVar19,0x55);
          auVar19 = vpmulld_avx(auVar19,auVar17);
          iVar41 = auVar19._0_4_;
        }
        uVar27 = 1;
        if (1 < uVar3) {
          uVar27 = (this_00->d).d[1];
        }
        uVar23 = (ulong)puVar10[uVar30];
        fVar1 = pfVar12[uVar30];
        if (uVar6 != 0) {
          auVar36 = vpbroadcastd_avx512f(ZEXT416(1));
          uVar24 = 0;
          do {
            auVar38 = vpbroadcastq_avx512f();
            auVar39 = vmovdqa64_avx512f(auVar36);
            auVar36 = vporq_avx512f(auVar38,auVar34);
            auVar38 = vporq_avx512f(auVar38,auVar35);
            uVar18 = vpcmpuq_avx512f(auVar38,auVar37,2);
            bVar20 = (byte)uVar18;
            uVar18 = vpcmpuq_avx512f(auVar36,auVar37,2);
            bVar21 = (byte)uVar18;
            uVar32 = CONCAT11(bVar21,bVar20);
            auVar36 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar24));
            auVar38._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar36._4_4_;
            auVar38._0_4_ = (uint)(bVar20 & 1) * auVar36._0_4_;
            auVar38._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar36._8_4_;
            auVar38._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar36._12_4_;
            auVar38._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar36._16_4_;
            auVar38._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar36._20_4_;
            auVar38._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar36._24_4_;
            auVar38._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar36._28_4_;
            auVar38._32_4_ = (uint)(bVar21 & 1) * auVar36._32_4_;
            auVar38._36_4_ = (uint)(bVar21 >> 1 & 1) * auVar36._36_4_;
            auVar38._40_4_ = (uint)(bVar21 >> 2 & 1) * auVar36._40_4_;
            auVar38._44_4_ = (uint)(bVar21 >> 3 & 1) * auVar36._44_4_;
            auVar38._48_4_ = (uint)(bVar21 >> 4 & 1) * auVar36._48_4_;
            auVar38._52_4_ = (uint)(bVar21 >> 5 & 1) * auVar36._52_4_;
            auVar38._56_4_ = (uint)(bVar21 >> 6 & 1) * auVar36._56_4_;
            auVar38._60_4_ = (uint)(bVar21 >> 7) * auVar36._60_4_;
            uVar24 = uVar24 + 0x10;
            auVar36 = vpmulld_avx512f(auVar38,auVar39);
          } while (((ulong)uVar6 + 0xf & 0xfffffffffffffff0) != uVar24);
          auVar34 = vmovdqa32_avx512f(auVar36);
          auVar35._0_4_ =
               (uint)(bVar20 & 1) * auVar34._0_4_ | (uint)!(bool)(bVar20 & 1) * auVar39._0_4_;
          bVar16 = (bool)((byte)(uVar32 >> 1) & 1);
          auVar35._4_4_ = (uint)bVar16 * auVar34._4_4_ | (uint)!bVar16 * auVar39._4_4_;
          bVar16 = (bool)((byte)(uVar32 >> 2) & 1);
          auVar35._8_4_ = (uint)bVar16 * auVar34._8_4_ | (uint)!bVar16 * auVar39._8_4_;
          bVar16 = (bool)((byte)(uVar32 >> 3) & 1);
          auVar35._12_4_ = (uint)bVar16 * auVar34._12_4_ | (uint)!bVar16 * auVar39._12_4_;
          bVar16 = (bool)((byte)(uVar32 >> 4) & 1);
          auVar35._16_4_ = (uint)bVar16 * auVar34._16_4_ | (uint)!bVar16 * auVar39._16_4_;
          bVar16 = (bool)((byte)(uVar32 >> 5) & 1);
          auVar35._20_4_ = (uint)bVar16 * auVar34._20_4_ | (uint)!bVar16 * auVar39._20_4_;
          bVar16 = (bool)((byte)(uVar32 >> 6) & 1);
          auVar35._24_4_ = (uint)bVar16 * auVar34._24_4_ | (uint)!bVar16 * auVar39._24_4_;
          bVar16 = (bool)((byte)(uVar32 >> 7) & 1);
          auVar35._28_4_ = (uint)bVar16 * auVar34._28_4_ | (uint)!bVar16 * auVar39._28_4_;
          auVar35._32_4_ =
               (uint)(bVar21 & 1) * auVar34._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar39._32_4_;
          bVar16 = (bool)(bVar21 >> 1 & 1);
          auVar35._36_4_ = (uint)bVar16 * auVar34._36_4_ | (uint)!bVar16 * auVar39._36_4_;
          bVar16 = (bool)(bVar21 >> 2 & 1);
          auVar35._40_4_ = (uint)bVar16 * auVar34._40_4_ | (uint)!bVar16 * auVar39._40_4_;
          bVar16 = (bool)(bVar21 >> 3 & 1);
          auVar35._44_4_ = (uint)bVar16 * auVar34._44_4_ | (uint)!bVar16 * auVar39._44_4_;
          bVar16 = (bool)(bVar21 >> 4 & 1);
          auVar35._48_4_ = (uint)bVar16 * auVar34._48_4_ | (uint)!bVar16 * auVar39._48_4_;
          bVar16 = (bool)(bVar21 >> 5 & 1);
          auVar35._52_4_ = (uint)bVar16 * auVar34._52_4_ | (uint)!bVar16 * auVar39._52_4_;
          bVar16 = (bool)(bVar21 >> 6 & 1);
          auVar35._56_4_ = (uint)bVar16 * auVar34._56_4_ | (uint)!bVar16 * auVar39._56_4_;
          auVar35._60_4_ =
               (uint)(bVar21 >> 7) * auVar34._60_4_ | (uint)!(bool)(bVar21 >> 7) * auVar39._60_4_;
          auVar33 = vextracti64x4_avx512f(auVar35,1);
          auVar34 = vpmulld_avx512f(auVar35,ZEXT3264(auVar33));
          auVar19 = vpmulld_avx(auVar34._0_16_,auVar34._16_16_);
          auVar17 = vpshufd_avx(auVar19,0xee);
          auVar19 = vpmulld_avx(auVar19,auVar17);
          auVar17 = vpshufd_avx(auVar19,0x55);
          auVar19 = vpmulld_avx(auVar19,auVar17);
          iVar42 = auVar19._0_4_;
        }
        uVar25 = 1;
        if (1 < uVar6) {
          uVar25 = (dEdxi->d).d[1];
        }
        if ((uVar8 != uVar4) || (uVar25 != uVar27)) goto LAB_001831cb;
        uVar25 = (int)(uVar30 % (ulong)uVar7) * iVar42;
        uVar24 = (ulong)uVar27 * (ulong)uVar8;
        if (uVar24 != 0) {
          lVar29 = 0;
          fVar2 = pfVar15[uVar30];
          uVar31 = uVar24;
          do {
            auVar34._0_4_ =
                 expf(pfVar13[(ulong)(uint)((int)(uVar30 % (ulong)uVar5) * iVar41) + lVar29] - fVar2
                     );
            auVar34._4_60_ = extraout_var_00;
            auVar19 = vfmadd213ss_fma(auVar34._0_16_,ZEXT416((uint)fVar1),
                                      ZEXT416((uint)pfVar14[(ulong)uVar25 + lVar29]));
            pfVar14[(ulong)uVar25 + lVar29] = auVar19._0_4_;
            lVar29 = lVar29 + 1;
            uVar31 = uVar31 - 1;
          } while (uVar31 != 0);
        }
        if (uVar24 < uVar23 || uVar24 - uVar23 == 0) goto LAB_001831ed;
        auVar36 = vmovdqu64_avx512f(local_98);
        auVar37 = vmovdqu64_avx512f(local_d8);
        auVar34 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        uVar30 = (ulong)((int)uVar30 + 1);
        pfVar14[uVar25 + uVar23] = pfVar14[uVar25 + uVar23] - fVar1;
      } while (uVar30 < uVar26);
    }
  }
  else {
    uVar28 = (ulong)*this->pval;
    fVar1 = *dEdf->v;
    Tensor::operator*(&local_50,this_00);
    fVar2 = *this->logz;
    Tensor::operator*(&local_f8,dEdxi);
    pfVar22 = local_f8.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data;
    if ((local_f8.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value !=
         local_50.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value) ||
       (local_f8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value !=
        local_50.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value)) {
LAB_001831cb:
      __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, SrcXprType = Eigen::CwiseUnaryOp<cnn::FNegLogSoftmaxBackward, const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                   );
    }
    if (0 < local_50.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_cols.m_value *
            local_50.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_rows.m_value) {
      lVar29 = 0;
      do {
        auVar37._0_4_ =
             expf(local_50.
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                  .
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .m_data[lVar29] - fVar2);
        auVar37._4_60_ = extraout_var;
        auVar19 = vfmadd213ss_fma(auVar37._0_16_,ZEXT416((uint)fVar1),ZEXT416((uint)pfVar22[lVar29])
                                 );
        pfVar22[lVar29] = auVar19._0_4_;
        lVar29 = lVar29 + 1;
      } while (local_50.
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_cols.m_value *
               local_50.
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_rows.m_value - lVar29 != 0);
    }
    Tensor::operator*(&local_f8,dEdxi);
    if (local_f8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value *
        local_f8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value - uVar28 == 0 ||
        local_f8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value *
        local_f8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value < (long)uVar28) {
LAB_001831ed:
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>, 1>::operator()(Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Level = 1]"
                   );
    }
    local_f8.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data[uVar28] =
         local_f8.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_data[uVar28] - fVar1;
  }
  return;
}

Assistant:

void PickNegLogSoftmax::backward_impl(const vector<const Tensor*>& xs,
                            const Tensor& fx,
                            const Tensor& dEdf,
                            unsigned i,
                            Tensor& dEdxi) const {
  if (xs[0]->d.cols() == 1) {
#if HAVE_CUDA
    if(pval) {
      const auto elem = *pval;
      gpu::pnlsoftmax_backward(dEdxi.d.size(), elem, xs[0]->v, dEdf.v, logz, dEdxi.v);
    } else {
      assert(pvals);
      assert(pvals->size() == fx.d.batch_elems()); 
      // TODO: Again, it would be nice to do this with a single kernel
      for(unsigned b = 0; b < pvals->size(); ++b) {
        const auto elem = (*pvals)[b];
        gpu::pnlsoftmax_backward(dEdxi.d.batch_size(), elem, xs[0]->batch_ptr(b), dEdf.v+b, logz+b, dEdxi.batch_ptr(b));
      }
    }
#else
    if(pval) {
      const auto elem = *pval;
      const float err = dEdf.v[0];
      auto x = **xs[0];
      // logz is computed in the forward pass and cached
      *dEdxi += x.unaryExpr(FNegLogSoftmaxBackward(*logz, err));
      //*dEdxi += x.unaryExpr(scalar_nlsoftmax_backward_op<float>(*logz, err));
      (*dEdxi)(elem) -= err;
    } else {
      assert(pvals);
      assert(pvals->size() == fx.d.batch_elems()); 
      for(unsigned b = 0; b < pvals->size(); ++b) {
        const auto elem = (*pvals)[b];
        const float err = dEdf.v[b];
        auto x = xs[0]->batch_matrix(b);
        auto dEdxi_mat = dEdxi.batch_matrix(b);
        dEdxi_mat += x.unaryExpr(FNegLogSoftmaxBackward(logz[b], err));
        //dEdxi_mat += x.unaryExpr(scalar_nlsoftmax_backward_op<float>(logz[b], err));
        dEdxi_mat(elem) -= err;
      }
    }
#endif
  } else {
    throw std::runtime_error("PickNegLogSoftmax::backward not yet implemented for multiple columns");
  }
}